

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O3

TestCaseGroup *
vkt::SpirVAssembly::anon_unknown_5::createOpSModComputeGroup
          (TestContext *testCtx,qpTestResult negFailResult)

{
  deInt32 *pdVar1;
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
  *this;
  uint uVar2;
  char *pcVar3;
  deUint32 dVar4;
  TestNode *this_00;
  char *pcVar5;
  long *plVar6;
  undefined8 *puVar7;
  BufferInterface *pBVar8;
  SpvAsmComputeShaderCase *this_01;
  int iVar9;
  ulong *puVar10;
  int iVar11;
  pointer piVar12;
  pointer piVar13;
  undefined8 unaff_RBP;
  undefined8 uVar14;
  ulong uVar15;
  int ndx_2;
  int *typedPtr;
  int *typedPtr_1;
  int ndx;
  long lVar16;
  vector<int,_std::allocator<int>_> inputInts2;
  vector<int,_std::allocator<int>_> inputInts1;
  vector<int,_std::allocator<int>_> outputInts;
  Random rnd;
  SharedPtr<vkt::SpirVAssembly::BufferInterface> local_288;
  BufferInterface local_278;
  long lStack_270;
  allocator<char> local_262;
  allocator<char> local_261;
  char **local_260;
  vector<int,_std::allocator<int>_> local_258;
  vector<int,_std::allocator<int>_> local_238;
  TestNode *local_218;
  uint local_20c;
  vector<int,_std::allocator<int>_> local_208;
  ulong *local_1e8;
  long local_1e0;
  ulong local_1d8;
  long lStack_1d0;
  long *local_1c8;
  undefined8 local_1c0;
  long local_1b8;
  undefined8 uStack_1b0;
  ulong *local_1a8;
  long local_1a0;
  ulong local_198 [2];
  TestContext *local_188;
  long *local_180 [2];
  long local_170 [2];
  deRandom local_160;
  undefined1 local_150 [88];
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
  local_f8 [24];
  int local_e0 [4];
  pointer local_d0;
  pointer local_c0;
  qpTestResult local_b8;
  _Alloc_hider local_b0;
  char *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  char *local_88;
  char *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_68;
  char *local_60;
  char *local_58;
  qpTestResult local_50;
  undefined8 local_4c;
  undefined8 uStack_44;
  
  this_00 = (TestNode *)operator_new(0x70);
  local_188 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_00,testCtx,"opsmod","Test the OpSMod instruction");
  local_218 = this_00;
  dVar4 = deStringHash((this_00->m_name)._M_dataplus._M_p);
  deRandom_init(&local_160,dVar4);
  local_88 = "positive";
  local_80 = "Output doesn\'t match with expected";
  local_78 = 1;
  uStack_70 = 0x10000;
  local_68 = 100;
  local_60 = "all";
  local_58 = "Inconsistent results, but within specification";
  local_4c = 0x10000ffff0000;
  uStack_44 = 0x64ffffff9c;
  local_260 = &local_88;
  uVar14 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  local_50 = negFailResult;
  do {
    ComputeShaderSpec::ComputeShaderSpec((ComputeShaderSpec *)local_150);
    local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)operator_new(800);
    piVar12 = local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + 200;
    local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = piVar12;
    memset(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start,0,800);
    local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar12;
    local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)operator_new(800);
    local_20c = (uint)uVar14;
    piVar12 = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + 200;
    local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = piVar12;
    memset(local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start,0,800);
    local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar12;
    local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)operator_new(800);
    piVar13 = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + 200;
    local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = piVar13;
    memset(local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start,0,800);
    piVar12 = local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar9 = *(int *)((long)local_260 + 0x14);
    iVar11 = *(int *)(local_260 + 3);
    lVar16 = 0;
    local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar13;
    do {
      dVar4 = deRandom_getUint32(&local_160);
      piVar13 = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (iVar11 != 0x7fffffff || iVar9 != -0x80000000) {
        dVar4 = dVar4 % ((iVar11 - iVar9) + 1U) + iVar9;
      }
      piVar12[lVar16] = dVar4;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 200);
    iVar9 = *(int *)((long)local_260 + 0x1c);
    iVar11 = *(int *)(local_260 + 4);
    lVar16 = 0;
    do {
      do {
        dVar4 = deRandom_getUint32(&local_160);
        if (iVar11 != 0x7fffffff || iVar9 != -0x80000000) {
          dVar4 = dVar4 % ((iVar11 - iVar9) + 1U) + iVar9;
        }
      } while (dVar4 == 0);
      piVar13[lVar16] = dVar4;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 200);
    lVar16 = 0;
    do {
      uVar2 = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar16];
      iVar11 = local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar16] % (int)uVar2;
      iVar9 = ((int)(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar16] ^ uVar2) >> 0x1f & uVar2) + iVar11;
      if (iVar11 == 0) {
        iVar9 = 0;
      }
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar16] = iVar9;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 200);
    pcVar5 = getComputeAsmShaderPreamble();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_180,pcVar5,&local_261);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_180);
    puVar10 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar10) {
      local_1d8 = *puVar10;
      lStack_1d0 = plVar6[3];
      local_1e8 = &local_1d8;
    }
    else {
      local_1d8 = *puVar10;
      local_1e8 = (ulong *)*plVar6;
    }
    local_1e0 = plVar6[1];
    *plVar6 = (long)puVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    pcVar5 = getComputeAsmCommonTypes();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,pcVar5,&local_262);
    uVar15 = 0xf;
    if (local_1e8 != &local_1d8) {
      uVar15 = local_1d8;
    }
    if (uVar15 < (ulong)(local_1a0 + local_1e0)) {
      uVar15 = 0xf;
      if (local_1a8 != local_198) {
        uVar15 = local_198[0];
      }
      if (uVar15 < (ulong)(local_1a0 + local_1e0)) goto LAB_0057e3e9;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,(ulong)local_1e8);
    }
    else {
LAB_0057e3e9:
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)local_1a8);
    }
    plVar6 = puVar7 + 2;
    if ((long *)*puVar7 == plVar6) {
      local_1b8 = *plVar6;
      uStack_1b0 = puVar7[3];
      local_1c8 = &local_1b8;
    }
    else {
      local_1b8 = *plVar6;
      local_1c8 = (long *)*puVar7;
    }
    local_1c0 = puVar7[1];
    *puVar7 = plVar6;
    puVar7[1] = 0;
    *(undefined1 *)plVar6 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    pBVar8 = (BufferInterface *)(plVar6 + 2);
    if ((BufferInterface *)*plVar6 == pBVar8) {
      local_278._vptr_BufferInterface = pBVar8->_vptr_BufferInterface;
      lStack_270 = plVar6[3];
      local_288.m_ptr = &local_278;
    }
    else {
      local_278._vptr_BufferInterface = pBVar8->_vptr_BufferInterface;
      local_288.m_ptr = (BufferInterface *)*plVar6;
    }
    local_288.m_state = (SharedPtrStateBase *)plVar6[1];
    *plVar6 = (long)pBVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_150,(string *)&local_288);
    if (local_288.m_ptr != &local_278) {
      operator_delete(local_288.m_ptr,(long)local_278._vptr_BufferInterface + 1);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
    if (local_1a8 != local_198) {
      operator_delete(local_1a8,local_198[0] + 1);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    this = (vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
            *)(local_150 + 0x40);
    if (local_180[0] != local_170) {
      operator_delete(local_180[0],local_170[0] + 1);
    }
    pBVar8 = (BufferInterface *)operator_new(0x20);
    pBVar8->_vptr_BufferInterface = (_func_int **)&PTR__Buffer_00d2b318;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)(pBVar8 + 1),&local_238);
    local_288.m_state = (SharedPtrStateBase *)0x0;
    local_288.m_ptr = pBVar8;
    local_288.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_288.m_state)->strongRefCount = 0;
    (local_288.m_state)->weakRefCount = 0;
    (local_288.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d2b2d8;
    local_288.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pBVar8;
    (local_288.m_state)->strongRefCount = 1;
    (local_288.m_state)->weakRefCount = 1;
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
    ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>(this,&local_288);
    if (local_288.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_288.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_288.m_ptr = (BufferInterface *)0x0;
        (*(local_288.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_288.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (local_288.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_288.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pBVar8 = (BufferInterface *)operator_new(0x20);
    pBVar8->_vptr_BufferInterface = (_func_int **)&PTR__Buffer_00d2b318;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)(pBVar8 + 1),&local_258);
    local_288.m_state = (SharedPtrStateBase *)0x0;
    local_288.m_ptr = pBVar8;
    local_288.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_288.m_state)->strongRefCount = 0;
    (local_288.m_state)->weakRefCount = 0;
    (local_288.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d2b2d8;
    local_288.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pBVar8;
    (local_288.m_state)->strongRefCount = 1;
    (local_288.m_state)->weakRefCount = 1;
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
    ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>(this,&local_288);
    if (local_288.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_288.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_288.m_ptr = (BufferInterface *)0x0;
        (*(local_288.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_288.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (local_288.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_288.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pBVar8 = (BufferInterface *)operator_new(0x20);
    pBVar8->_vptr_BufferInterface = (_func_int **)&PTR__Buffer_00d2b318;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)(pBVar8 + 1),&local_208);
    local_288.m_state = (SharedPtrStateBase *)0x0;
    local_288.m_ptr = pBVar8;
    local_288.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_288.m_state)->strongRefCount = 0;
    (local_288.m_state)->weakRefCount = 0;
    (local_288.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d2b2d8;
    local_288.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pBVar8;
    (local_288.m_state)->strongRefCount = 1;
    (local_288.m_state)->weakRefCount = 1;
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
    ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>(local_f8,&local_288);
    if (local_288.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_288.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_288.m_ptr = (BufferInterface *)0x0;
        (*(local_288.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_288.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (local_288.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_288.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pcVar3 = local_a8;
    local_e0[0] = 200;
    local_e0[1] = 1;
    local_e0[2] = 1;
    local_b8 = *(qpTestResult *)(local_260 + 2);
    pcVar5 = local_260[1];
    strlen(pcVar5);
    std::__cxx11::string::_M_replace((ulong)&local_b0,0,pcVar3,(ulong)pcVar5);
    this_01 = (SpvAsmComputeShaderCase *)operator_new(0x140);
    SpvAsmComputeShaderCase::SpvAsmComputeShaderCase
              (this_01,local_188,*local_260,"",(ComputeShaderSpec *)local_150,COMPUTE_TEST_USES_NONE
              );
    tcu::TestNode::addChild(local_218,(TestNode *)this_01);
    if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_p != &local_a0) {
      operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
    }
    if (local_d0 != (pointer)0x0) {
      operator_delete(local_d0,(long)local_c0 - (long)local_d0);
    }
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
    ::~vector((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               *)local_f8);
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
    ::~vector((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               *)this);
    if ((undefined1 *)local_150._32_8_ != local_150 + 0x30) {
      operator_delete((void *)local_150._32_8_,local_150._48_8_ + 1);
    }
    uVar2 = local_20c;
    if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
      operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
    }
    local_260 = &local_60;
    uVar14 = 0;
    if ((uVar2 & 1) == 0) {
      return (TestCaseGroup *)local_218;
    }
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createOpSModComputeGroup (tcu::TestContext& testCtx, qpTestResult negFailResult)
{
	de::MovePtr<tcu::TestCaseGroup>	group			(new tcu::TestCaseGroup(testCtx, "opsmod", "Test the OpSMod instruction"));
	de::Random						rnd				(deStringHash(group->getName()));
	const int						numElements		= 200;

	const struct CaseParams
	{
		const char*		name;
		const char*		failMessage;		// customized status message
		qpTestResult	failResult;			// override status on failure
		int				op1Min, op1Max;		// operand ranges
		int				op2Min, op2Max;
	} cases[] =
	{
		{ "positive",	"Output doesn't match with expected",				QP_TEST_RESULT_FAIL,	0,		65536,	0,		100 },
		{ "all",		"Inconsistent results, but within specification",	negFailResult,			-65536,	65536,	-100,	100 },	// see below
	};
	// If either operand is negative the result is undefined. Some implementations may still return correct values.

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
	{
		const CaseParams&	params		= cases[caseNdx];

		ComputeShaderSpec	spec;
		vector<deInt32>		inputInts1	(numElements, 0);
		vector<deInt32>		inputInts2	(numElements, 0);
		vector<deInt32>		outputInts	(numElements, 0);

		fillRandomScalars(rnd, params.op1Min, params.op1Max, &inputInts1[0], numElements);
		fillRandomScalars(rnd, params.op2Min, params.op2Max, &inputInts2[0], numElements, filterNotZero);

		for (int ndx = 0; ndx < numElements; ++ndx)
		{
			deInt32 rem = inputInts1[ndx] % inputInts2[ndx];
			if (rem == 0)
			{
				outputInts[ndx] = 0;
			}
			else if ((inputInts1[ndx] >= 0) == (inputInts2[ndx] >= 0))
			{
				// They have the same sign
				outputInts[ndx] = rem;
			}
			else
			{
				// They have opposite sign.  The remainder operation takes the
				// sign inputInts1[ndx] but OpSMod is supposed to take ths sign
				// of inputInts2[ndx].  Adding inputInts2[ndx] will ensure that
				// the result has the correct sign and that it is still
				// congruent to inputInts1[ndx] modulo inputInts2[ndx]
				//
				// See also http://mathforum.org/library/drmath/view/52343.html
				outputInts[ndx] = rem + inputInts2[ndx];
			}
		}

		spec.assembly =
			string(getComputeAsmShaderPreamble()) +

			"OpName %main           \"main\"\n"
			"OpName %id             \"gl_GlobalInvocationID\"\n"

			"OpDecorate %id BuiltIn GlobalInvocationId\n"

			"OpDecorate %buf BufferBlock\n"
			"OpDecorate %indata1 DescriptorSet 0\n"
			"OpDecorate %indata1 Binding 0\n"
			"OpDecorate %indata2 DescriptorSet 0\n"
			"OpDecorate %indata2 Binding 1\n"
			"OpDecorate %outdata DescriptorSet 0\n"
			"OpDecorate %outdata Binding 2\n"
			"OpDecorate %i32arr ArrayStride 4\n"
			"OpMemberDecorate %buf 0 Offset 0\n"

			+ string(getComputeAsmCommonTypes()) +

			"%buf        = OpTypeStruct %i32arr\n"
			"%bufptr     = OpTypePointer Uniform %buf\n"
			"%indata1    = OpVariable %bufptr Uniform\n"
			"%indata2    = OpVariable %bufptr Uniform\n"
			"%outdata    = OpVariable %bufptr Uniform\n"

			"%id        = OpVariable %uvec3ptr Input\n"
			"%zero      = OpConstant %i32 0\n"

			"%main      = OpFunction %void None %voidf\n"
			"%label     = OpLabel\n"
			"%idval     = OpLoad %uvec3 %id\n"
			"%x         = OpCompositeExtract %u32 %idval 0\n"
			"%inloc1    = OpAccessChain %i32ptr %indata1 %zero %x\n"
			"%inval1    = OpLoad %i32 %inloc1\n"
			"%inloc2    = OpAccessChain %i32ptr %indata2 %zero %x\n"
			"%inval2    = OpLoad %i32 %inloc2\n"
			"%rem       = OpSMod %i32 %inval1 %inval2\n"
			"%outloc    = OpAccessChain %i32ptr %outdata %zero %x\n"
			"             OpStore %outloc %rem\n"
			"             OpReturn\n"
			"             OpFunctionEnd\n";

		spec.inputs.push_back	(BufferSp(new Int32Buffer(inputInts1)));
		spec.inputs.push_back	(BufferSp(new Int32Buffer(inputInts2)));
		spec.outputs.push_back	(BufferSp(new Int32Buffer(outputInts)));
		spec.numWorkGroups		= IVec3(numElements, 1, 1);
		spec.failResult			= params.failResult;
		spec.failMessage		= params.failMessage;

		group->addChild(new SpvAsmComputeShaderCase(testCtx, params.name, "", spec));
	}

	return group.release();
}